

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall GraphBuilder::printNodes(GraphBuilder *this,ostream *ostream)

{
  bool bVar1;
  Node *this_00;
  ostream *in_RSI;
  long in_RDI;
  value_type *iterator_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
  *__range1_1;
  value_type *iterator;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  *__range1;
  unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
  *in_stack_ffffffffffffff58;
  ostream *poVar2;
  ostream *in_stack_ffffffffffffff60;
  string local_90 [32];
  reference local_70;
  _Node_iterator_base<Node_*,_false> local_68;
  _Node_iterator_base<Node_*,_false> local_60;
  long local_58;
  string local_50 [32];
  reference local_30;
  _Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false> local_20;
  
  this_00 = (Node *)(in_RDI + 0x40);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
       ::begin((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
                *)in_stack_ffffffffffffff58);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
       ::end((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
              *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::__detail::
               _Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
                            *)0x1944a2);
    in_stack_ffffffffffffff60 = in_RSI;
    Node::dump_abi_cxx11_(this_00);
    std::operator<<(in_stack_ffffffffffffff60,local_50);
    std::__cxx11::string::~string(local_50);
    std::__detail::
    _Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
                *)in_stack_ffffffffffffff60);
  }
  local_58 = in_RDI + 8;
  local_60._M_cur =
       (__node_type *)
       std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
       ::begin(in_stack_ffffffffffffff58);
  local_68._M_cur =
       (__node_type *)
       std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
       ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    local_70 = std::__detail::_Node_const_iterator<Node_*,_true,_false>::operator*
                         ((_Node_const_iterator<Node_*,_true,_false> *)0x19453a);
    poVar2 = in_RSI;
    Node::dump_abi_cxx11_(this_00);
    std::operator<<(poVar2,local_90);
    std::__cxx11::string::~string(local_90);
    std::__detail::_Node_const_iterator<Node_*,_true,_false>::operator++
              ((_Node_const_iterator<Node_*,_true,_false> *)in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void GraphBuilder::printNodes(std::ostream &ostream) const {
    for (const auto &iterator : llvmToNodeMap_) {
        ostream << iterator.second->dump();
    }
    for (const auto &iterator : artificialNodes_) {
        ostream << iterator->dump();
    }
}